

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

bool parse_json(const_iterator *it,const_iterator *end,json *out)

{
  ulong uVar1;
  size_t sVar2;
  char cVar3;
  char cVar4;
  ulong uVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  undefined **ppuVar8;
  char *pcVar9;
  bool bVar10;
  iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  adapter;
  json_error_locator err_loc;
  string json_sub;
  _Alloc_hider in_stack_fffffffffffffdb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  string local_208;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined **local_1c0;
  long local_1b8;
  char local_1b0;
  undefined1 local_1a8 [24];
  undefined1 local_190 [16];
  undefined **local_180;
  uint local_178;
  _Bit_pointer local_170;
  const_iterator *local_168;
  _Any_data local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  token_type local_140;
  lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  const_iterator *local_98;
  json *local_90;
  _Any_data local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  data local_40;
  
  local_1c0 = &PTR_null_0025e380;
  local_1b8 = 0;
  local_1b0 = '\0';
  local_68 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  pcVar9 = (char *)0x1;
  adapter.end._M_current = local_68;
  adapter.current._M_current = end->_M_current;
  local_168 = it;
  local_98 = end;
  local_90 = out;
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::
  parser<nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            ((parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_160,
             (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)it->_M_current,adapter,
             (parser_callback_t<basic_json<nlohmann::json_abi_v3_11_3::ordered_map>_> *)0x1,false,
             (bool)SUB81(in_stack_fffffffffffffdb8._M_p,0));
  local_190._0_8_ = (undefined **)0x0;
  local_190._8_4_ = 0;
  local_180 = (undefined **)0x0;
  local_178 = 0;
  local_170 = (_Bit_pointer)0x0;
LAB_001aa579:
  sVar2 = local_138.position.chars_read_total;
  switch(local_140) {
  case literal_true:
    cVar4 = (*(code *)local_1c0[1])(&local_1c0,1);
    break;
  case literal_false:
    cVar4 = (*(code *)local_1c0[1])(&local_1c0,0);
    break;
  case literal_null:
    cVar4 = (*(code *)*local_1c0)(&local_1c0);
    break;
  case value_string:
    cVar4 = (*(code *)local_1c0[5])(&local_1c0,&local_138.token_buffer);
    break;
  case value_unsigned:
    cVar4 = (*(code *)local_1c0[3])(&local_1c0,local_138.value_unsigned);
    break;
  case value_integer:
    cVar4 = (*(code *)local_1c0[2])(&local_1c0,local_138.value_integer);
    break;
  case value_float:
    if (0x7fefffffffffffff < (ulong)ABS(local_138.value_float)) {
      nlohmann::json_abi_v3_11_3::detail::
      lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::get_token_string((string *)local_1e8,&local_138);
      nlohmann::json_abi_v3_11_3::detail::
      lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::get_token_string(&local_208,&local_138);
      local_1a8[0] = 0x27;
      nlohmann::json_abi_v3_11_3::detail::
      concat<std::__cxx11::string,char_const(&)[26],std::__cxx11::string,char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffdb8,(detail *)"number overflow parsing \'",
                 (char (*) [26])&local_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 pcVar9);
      nlohmann::json_abi_v3_11_3::detail::out_of_range::create<std::nullptr_t,_0>
                ((out_of_range *)local_228,0x196,(string *)&stack0xfffffffffffffdb8,(void *)0x0);
      cVar4 = (*(code *)local_1c0[0xc])(&local_1c0,sVar2,local_1e8,local_228);
      local_228._0_8_ = &PTR__exception_0025dfa8;
      std::runtime_error::~runtime_error((runtime_error *)(local_228 + 0x10));
      std::exception::~exception((exception *)local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffdb8._M_p != &local_238) {
        operator_delete(in_stack_fffffffffffffdb8._M_p,
                        CONCAT26(local_238._M_allocated_capacity._6_2_,
                                 CONCAT24(local_238._M_allocated_capacity._4_2_,
                                          local_238._M_allocated_capacity._0_4_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      uVar6 = local_1d8._M_allocated_capacity;
      ppuVar8 = (undefined **)local_1e8._0_8_;
      if ((undefined1 *)local_1e8._0_8_ == local_1e8 + 0x10) goto LAB_001aaba0;
      goto LAB_001aab98;
    }
    cVar4 = (*(code *)local_1c0[4])(&local_1c0,&local_138.token_buffer);
    break;
  case begin_array:
    cVar4 = (*(code *)local_1c0[10])(&local_1c0,0xffffffffffffffff);
    if (cVar4 == '\0') goto LAB_001aa92a;
    local_140 = nlohmann::json_abi_v3_11_3::detail::
                lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::scan(&local_138);
    if (local_140 == end_array) {
      cVar4 = (*(code *)local_1c0[0xb])(&local_1c0);
      break;
    }
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)local_190,true);
    goto LAB_001aa579;
  case begin_object:
    cVar4 = (*(code *)local_1c0[7])(&local_1c0,0xffffffffffffffff);
    if (cVar4 == '\0') goto LAB_001aa92a;
    local_140 = nlohmann::json_abi_v3_11_3::detail::
                lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::scan(&local_138);
    sVar2 = local_138.position.chars_read_total;
    if (local_140 == end_object) {
      cVar4 = (*(code *)local_1c0[9])(&local_1c0);
      break;
    }
    if (local_140 == value_string) {
      cVar4 = (*(code *)local_1c0[8])(&local_1c0);
      if (cVar4 == '\0') goto LAB_001aa92a;
      local_140 = nlohmann::json_abi_v3_11_3::detail::
                  lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::scan(&local_138);
      sVar2 = local_138.position.chars_read_total;
      if (local_140 == name_separator) goto code_r0x001aa8fa;
      nlohmann::json_abi_v3_11_3::detail::
      lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::get_token_string((string *)local_228,&local_138);
      local_1a8._16_8_ = local_138.position.lines_read;
      local_1a8._0_8_ = local_138.position.chars_read_total;
      local_1a8._8_8_ = local_138.position.chars_read_current_line;
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"object separator","");
      nlohmann::json_abi_v3_11_3::detail::
      parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::exception_message((string *)&stack0xfffffffffffffdb8,
                          (parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_160,name_separator,&local_208);
      nlohmann::json_abi_v3_11_3::detail::parse_error::create<std::nullptr_t,_0>
                ((parse_error *)local_1e8,0x65,(position_t *)local_1a8,
                 (string *)&stack0xfffffffffffffdb8,(void *)0x0);
      cVar4 = (*(code *)local_1c0[0xc])(&local_1c0,sVar2,local_228,local_1e8);
    }
    else {
      nlohmann::json_abi_v3_11_3::detail::
      lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::get_token_string((string *)local_228,&local_138);
      local_1a8._16_8_ = local_138.position.lines_read;
      local_1a8._0_8_ = local_138.position.chars_read_total;
      local_1a8._8_8_ = local_138.position.chars_read_current_line;
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_208.field_2._M_allocated_capacity = 0x6b207463656a626f;
      local_208.field_2._8_2_ = 0x7965;
      local_208._M_string_length = 10;
      local_208.field_2._M_local_buf[10] = '\0';
      nlohmann::json_abi_v3_11_3::detail::
      parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::exception_message((string *)&stack0xfffffffffffffdb8,
                          (parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_160,value_string,&local_208);
      nlohmann::json_abi_v3_11_3::detail::parse_error::create<std::nullptr_t,_0>
                ((parse_error *)local_1e8,0x65,(position_t *)local_1a8,
                 (string *)&stack0xfffffffffffffdb8,(void *)0x0);
      cVar4 = (*(code *)local_1c0[0xc])(&local_1c0,sVar2,local_228,local_1e8);
    }
    goto LAB_001aab2e;
  default:
    nlohmann::json_abi_v3_11_3::detail::
    lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::get_token_string((string *)local_228,&local_138);
    local_1a8._16_8_ = local_138.position.lines_read;
    local_1a8._0_8_ = local_138.position.chars_read_total;
    local_1a8._8_8_ = local_138.position.chars_read_current_line;
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208.field_2._M_allocated_capacity._0_6_ = 0x65756c6176;
    local_208._M_string_length = 5;
    nlohmann::json_abi_v3_11_3::detail::
    parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::exception_message((string *)&stack0xfffffffffffffdb8,
                        (parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_160,literal_or_value,&local_208);
    nlohmann::json_abi_v3_11_3::detail::parse_error::create<std::nullptr_t,_0>
              ((parse_error *)local_1e8,0x65,(position_t *)local_1a8,
               (string *)&stack0xfffffffffffffdb8,(void *)0x0);
    cVar4 = (*(code *)local_1c0[0xc])(&local_1c0,sVar2,local_228,local_1e8);
LAB_001aab2e:
    local_1e8._0_8_ = &PTR__exception_0025dfa8;
    std::runtime_error::~runtime_error((runtime_error *)(local_1e8 + 0x10));
    std::exception::~exception((exception *)local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffdb8._M_p != &local_238) {
      operator_delete(in_stack_fffffffffffffdb8._M_p,
                      CONCAT26(local_238._M_allocated_capacity._6_2_,
                               CONCAT24(local_238._M_allocated_capacity._4_2_,
                                        local_238._M_allocated_capacity._0_4_)) + 1);
    }
    uVar6 = local_208.field_2._M_allocated_capacity;
    _Var7._M_p = local_208._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
LAB_001aab7d:
      operator_delete(_Var7._M_p,uVar6 + 1);
    }
LAB_001aab85:
    uVar6 = local_218._M_allocated_capacity;
    ppuVar8 = (undefined **)local_228._0_8_;
    if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
LAB_001aab98:
      operator_delete(ppuVar8,uVar6 + 1);
    }
LAB_001aaba0:
    if ((undefined **)local_190._0_8_ != (undefined **)0x0) {
      operator_delete((void *)local_190._0_8_,(long)local_170 - local_190._0_8_);
    }
    if ((cVar4 != '\0') &&
       (local_140 = nlohmann::json_abi_v3_11_3::detail::
                    lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::scan(&local_138), sVar2 = local_138.position.chars_read_total,
       local_140 != end_of_input)) {
      nlohmann::json_abi_v3_11_3::detail::
      lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::get_token_string((string *)local_1e8,&local_138);
      local_208.field_2._M_allocated_capacity = local_138.position.lines_read;
      local_208._M_dataplus._M_p = (pointer)local_138.position.chars_read_total;
      local_208._M_string_length = local_138.position.chars_read_current_line;
      local_238._M_allocated_capacity._0_4_ = 0x756c6176;
      local_238._M_allocated_capacity._4_2_ = 0x65;
      _Var7._M_p = (pointer)&local_238;
      nlohmann::json_abi_v3_11_3::detail::
      parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::exception_message((string *)local_228,
                          (parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_160,end_of_input,(string *)&stack0xfffffffffffffdb8);
      nlohmann::json_abi_v3_11_3::detail::parse_error::create<std::nullptr_t,_0>
                ((parse_error *)local_190,0x65,(position_t *)&local_208,(string *)local_228,
                 (void *)0x0);
      (*(code *)local_1c0[0xc])(&local_1c0,sVar2,local_1e8,local_190);
      local_190._0_8_ = &PTR__exception_0025dfa8;
      std::runtime_error::~runtime_error((runtime_error *)&local_180);
      std::exception::~exception((exception *)local_190);
      if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
        operator_delete((void *)local_228._0_8_,local_218._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var7._M_p != &local_238) {
        operator_delete(_Var7._M_p,
                        CONCAT26(local_238._M_allocated_capacity._6_2_,
                                 CONCAT24(local_238._M_allocated_capacity._4_2_,
                                          local_238._M_allocated_capacity._0_4_)) + 1);
      }
      if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
        operator_delete((void *)local_1e8._0_8_,local_1d8._M_allocated_capacity + 1);
      }
    }
    nlohmann::json_abi_v3_11_3::detail::
    lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~lexer(&local_138);
    if ((code *)local_150._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_150._M_allocated_capacity)(&local_160,&local_160,3);
    }
    if ((code *)local_58._0_8_ != (code *)0x0) {
      (*(code *)local_58._0_8_)(local_68,local_68,3);
    }
    if (local_1b0 == '\0') {
      pcVar9 = local_98->_M_current;
    }
    else {
      pcVar9 = local_168->_M_current + local_1b8;
    }
    local_160._M_unused._M_object = &local_150;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_160,local_168->_M_current,pcVar9);
    local_78 = (undefined1  [16])0x0;
    local_88 = (_Any_data)0x0;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::__cxx11::string&>
              ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160,
               (parser_callback_t *)&local_88,true,false);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=(local_90,(basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_40);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_40,false);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_40);
    if ((code *)local_78._0_8_ != (code *)0x0) {
      (*(code *)local_78._0_8_)(&local_88,&local_88,__destroy_functor);
    }
    local_168->_M_current = pcVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_unused._0_8_ != &local_150) {
      operator_delete(local_160._M_unused._M_object,(ulong)(local_150._M_allocated_capacity + 1));
    }
    return true;
  case parse_error:
    nlohmann::json_abi_v3_11_3::detail::
    lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::get_token_string((string *)local_228,&local_138);
    local_1a8._16_8_ = local_138.position.lines_read;
    local_1a8._0_8_ = local_138.position.chars_read_total;
    local_1a8._8_8_ = local_138.position.chars_read_current_line;
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208.field_2._M_allocated_capacity._0_6_ = 0x65756c6176;
    local_208._M_string_length = 5;
    nlohmann::json_abi_v3_11_3::detail::
    parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::exception_message((string *)&stack0xfffffffffffffdb8,
                        (parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_160,uninitialized,&local_208);
    nlohmann::json_abi_v3_11_3::detail::parse_error::create<std::nullptr_t,_0>
              ((parse_error *)local_1e8,0x65,(position_t *)local_1a8,
               (string *)&stack0xfffffffffffffdb8,(void *)0x0);
    cVar4 = (*(code *)local_1c0[0xc])(&local_1c0,sVar2,local_228,local_1e8);
    goto LAB_001aab2e;
  case end_of_input:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.position.chars_read_total !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x1) {
      nlohmann::json_abi_v3_11_3::detail::
      lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::get_token_string((string *)local_228,&local_138);
      local_1a8._16_8_ = local_138.position.lines_read;
      local_1a8._0_8_ = local_138.position.chars_read_total;
      local_1a8._8_8_ = local_138.position.chars_read_current_line;
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_208.field_2._M_allocated_capacity._0_6_ = 0x65756c6176;
      local_208._M_string_length = 5;
      nlohmann::json_abi_v3_11_3::detail::
      parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::exception_message((string *)&stack0xfffffffffffffdb8,
                          (parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_160,literal_or_value,&local_208);
      nlohmann::json_abi_v3_11_3::detail::parse_error::create<std::nullptr_t,_0>
                ((parse_error *)local_1e8,0x65,(position_t *)local_1a8,
                 (string *)&stack0xfffffffffffffdb8,(void *)0x0);
      cVar4 = (*(code *)local_1c0[0xc])(&local_1c0,sVar2,local_228,local_1e8);
      goto LAB_001aab2e;
    }
    nlohmann::json_abi_v3_11_3::detail::
    lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::get_token_string((string *)local_228,&local_138);
    local_208.field_2._M_allocated_capacity = local_138.position.lines_read;
    local_208._M_dataplus._M_p = (pointer)local_138.position.chars_read_total;
    local_208._M_string_length = local_138.position.chars_read_current_line;
    _Var7._M_p = (pointer)&local_238;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffdb8,
               "attempting to parse an empty input; check that your input string or stream contains the expected JSON"
               ,"");
    nlohmann::json_abi_v3_11_3::detail::parse_error::create<std::nullptr_t,_0>
              ((parse_error *)local_1e8,0x65,(position_t *)&local_208,
               (string *)&stack0xfffffffffffffdb8,(void *)0x0);
    cVar4 = (*(code *)local_1c0[0xc])(&local_1c0,1,local_228,local_1e8);
    local_1e8._0_8_ = &PTR__exception_0025dfa8;
    std::runtime_error::~runtime_error((runtime_error *)(local_1e8 + 0x10));
    std::exception::~exception((exception *)local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p == &local_238) goto LAB_001aab85;
    uVar6 = CONCAT26(local_238._M_allocated_capacity._6_2_,
                     CONCAT24(local_238._M_allocated_capacity._4_2_,
                              local_238._M_allocated_capacity._0_4_));
    goto LAB_001aab7d;
  }
  if (cVar4 == '\0') {
LAB_001aa92a:
    cVar4 = '\0';
    goto LAB_001aaba0;
  }
  cVar4 = '\x01';
  if ((undefined **)local_190._0_8_ == local_180 && local_178 == 0) goto LAB_001aaba0;
LAB_001aa71f:
  uVar1 = (ulong)local_178 - 1;
  uVar5 = (ulong)local_178 + 0x3e;
  if (-1 < (long)uVar1) {
    uVar5 = uVar1;
  }
  if (((ulong)local_180[((long)uVar5 >> 6) +
                        ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
       (uVar1 & 0x3f) & 1) == 0) {
    local_140 = nlohmann::json_abi_v3_11_3::detail::
                lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::scan(&local_138);
    sVar2 = local_138.position.chars_read_total;
    if (local_140 == value_separator) {
      local_140 = nlohmann::json_abi_v3_11_3::detail::
                  lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::scan(&local_138);
      sVar2 = local_138.position.chars_read_total;
      if (local_140 != value_string) {
        nlohmann::json_abi_v3_11_3::detail::
        lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_token_string((string *)local_228,&local_138);
        local_1a8._16_8_ = local_138.position.lines_read;
        local_1a8._0_8_ = local_138.position.chars_read_total;
        local_1a8._8_8_ = local_138.position.chars_read_current_line;
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        local_208.field_2._M_allocated_capacity = 0x6b207463656a626f;
        local_208.field_2._8_2_ = 0x7965;
        local_208._M_string_length = 10;
        local_208.field_2._M_local_buf[10] = '\0';
        nlohmann::json_abi_v3_11_3::detail::
        parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::exception_message((string *)&stack0xfffffffffffffdb8,
                            (parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_160,value_string,&local_208);
        nlohmann::json_abi_v3_11_3::detail::parse_error::create<std::nullptr_t,_0>
                  ((parse_error *)local_1e8,0x65,(position_t *)local_1a8,
                   (string *)&stack0xfffffffffffffdb8,(void *)0x0);
        cVar4 = (*(code *)local_1c0[0xc])(&local_1c0,sVar2,local_228,local_1e8);
        goto LAB_001aab2e;
      }
      cVar4 = (*(code *)local_1c0[8])(&local_1c0);
      if (cVar4 == '\0') goto LAB_001aa92a;
      local_140 = nlohmann::json_abi_v3_11_3::detail::
                  lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::scan(&local_138);
      sVar2 = local_138.position.chars_read_total;
      if (local_140 != name_separator) {
        nlohmann::json_abi_v3_11_3::detail::
        lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::get_token_string((string *)local_228,&local_138);
        local_1a8._16_8_ = local_138.position.lines_read;
        local_1a8._0_8_ = local_138.position.chars_read_total;
        local_1a8._8_8_ = local_138.position.chars_read_current_line;
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"object separator","");
        nlohmann::json_abi_v3_11_3::detail::
        parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::exception_message((string *)&stack0xfffffffffffffdb8,
                            (parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_160,name_separator,&local_208);
        nlohmann::json_abi_v3_11_3::detail::parse_error::create<std::nullptr_t,_0>
                  ((parse_error *)local_1e8,0x65,(position_t *)local_1a8,
                   (string *)&stack0xfffffffffffffdb8,(void *)0x0);
        cVar4 = (*(code *)local_1c0[0xc])(&local_1c0,sVar2,local_228,local_1e8);
        goto LAB_001aab2e;
      }
LAB_001aa8ab:
      local_140 = nlohmann::json_abi_v3_11_3::detail::
                  lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::scan(&local_138);
      goto LAB_001aa579;
    }
    if (local_140 != end_object) {
      nlohmann::json_abi_v3_11_3::detail::
      lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::get_token_string((string *)local_228,&local_138);
      local_1a8._16_8_ = local_138.position.lines_read;
      local_1a8._0_8_ = local_138.position.chars_read_total;
      local_1a8._8_8_ = local_138.position.chars_read_current_line;
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_208._M_string_length = 6;
      local_208.field_2._M_allocated_capacity._0_7_ = 0x7463656a626f;
      nlohmann::json_abi_v3_11_3::detail::
      parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::exception_message((string *)&stack0xfffffffffffffdb8,
                          (parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_160,end_object,&local_208);
      nlohmann::json_abi_v3_11_3::detail::parse_error::create<std::nullptr_t,_0>
                ((parse_error *)local_1e8,0x65,(position_t *)local_1a8,
                 (string *)&stack0xfffffffffffffdb8,(void *)0x0);
      cVar4 = (*(code *)local_1c0[0xc])(&local_1c0,sVar2,local_228,local_1e8);
      goto LAB_001aab2e;
    }
    cVar3 = (*(code *)local_1c0[9])(&local_1c0);
    if (cVar3 == '\0') goto LAB_001aa92a;
    if ((undefined **)local_190._0_8_ == local_180 && local_178 == 0) {
      uVar6 = 0x3155;
      goto LAB_001ab400;
    }
  }
  else {
    local_140 = nlohmann::json_abi_v3_11_3::detail::
                lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::scan(&local_138);
    sVar2 = local_138.position.chars_read_total;
    if (local_140 == value_separator) goto LAB_001aa8ab;
    if (local_140 != end_array) {
      nlohmann::json_abi_v3_11_3::detail::
      lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::get_token_string((string *)local_228,&local_138);
      local_1a8._16_8_ = local_138.position.lines_read;
      local_1a8._0_8_ = local_138.position.chars_read_total;
      local_1a8._8_8_ = local_138.position.chars_read_current_line;
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      local_208.field_2._M_allocated_capacity._0_6_ = 0x7961727261;
      local_208._M_string_length = 5;
      nlohmann::json_abi_v3_11_3::detail::
      parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::exception_message((string *)&stack0xfffffffffffffdb8,
                          (parser<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_160,end_array,&local_208);
      nlohmann::json_abi_v3_11_3::detail::parse_error::create<std::nullptr_t,_0>
                ((parse_error *)local_1e8,0x65,(position_t *)local_1a8,
                 (string *)&stack0xfffffffffffffdb8,(void *)0x0);
      cVar4 = (*(code *)local_1c0[0xc])(&local_1c0,sVar2,local_228,local_1e8);
      goto LAB_001aab2e;
    }
    cVar3 = (*(code *)local_1c0[0xb])(&local_1c0);
    if (cVar3 == '\0') goto LAB_001aa92a;
    if (local_178 == 0 && (undefined **)local_190._0_8_ == local_180) {
      uVar6 = 0x311f;
LAB_001ab400:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
                 ,uVar6,"GGML_ASSERT(%s) failed","!states.empty()");
    }
  }
  bVar10 = local_178 == 0;
  local_178 = local_178 - 1;
  if (bVar10) {
    local_178 = 0x3f;
    local_180 = local_180 + -1;
  }
  if (((undefined **)local_190._0_8_ == local_180) && (local_178 == 0)) goto LAB_001aaba0;
  goto LAB_001aa71f;
code_r0x001aa8fa:
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)local_190,false);
  local_140 = nlohmann::json_abi_v3_11_3::detail::
              lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::scan(&local_138);
  goto LAB_001aa579;
}

Assistant:

static bool parse_json(std::string::const_iterator & it, const std::string::const_iterator & end, json & out) {
    // // https://json.nlohmann.me/features/parsing/sax_interface/
    struct json_error_locator : public nlohmann::json_sax<json> {
        std::size_t position;
        bool found_error;

        json_error_locator() : position(0), found_error(false) {}

        bool parse_error(std::size_t position, const std::string &, const json::exception &) override { // NOLINT
            this->position = position - 1;
            this->found_error = true;
            return false;
        }
        bool null() override { return true; } // NOLINT
        bool boolean(bool) override { return true; } // NOLINT
        bool number_integer(number_integer_t) override { return true; } // NOLINT
        bool number_unsigned(number_unsigned_t) override { return true; } // NOLINT
        bool number_float(number_float_t, const string_t &) override { return true; } // NOLINT
        bool string(string_t &) override { return true; } // NOLINT
        bool binary(binary_t &) override { return true; } // NOLINT
        bool start_object(std::size_t) override { return true; } // NOLINT
        bool key(string_t &) override { return true; } // NOLINT
        bool end_object() override { return true; }
        bool start_array(std::size_t) override { return true; } // NOLINT
        bool end_array() override { return true; }
    };
    json_error_locator err_loc;
    json::sax_parse(it, end, &err_loc);

    std::string::const_iterator temptative_end;
    if (err_loc.found_error) {
        temptative_end = it + err_loc.position;
    } else {
        temptative_end = end;
    }
    std::string json_sub {it, temptative_end};
    try {
        out = json::parse(json_sub);
        it = temptative_end;
        return true;
    } catch (const std::exception &) {
        return false;
    }
}